

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZ.hpp
# Opt level: O0

void __thiscall
qclab::qgates::RotationZ<std::complex<double>_>::RotationZ
          (RotationZ<std::complex<double>_> *this,real_type theta)

{
  real_type theta_local;
  RotationZ<std::complex<double>_> *this_local;
  
  QRotationGate1<std::complex<double>_>::QRotationGate1
            (&this->super_QRotationGate1<std::complex<double>_>,0,theta,false);
  (this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_0016ad20;
  return;
}

Assistant:

RotationZ( const real_type theta )
        : QRotationGate1< T >( 0 , theta )
        { }